

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basisu_gpu_texture.h
# Opt level: O2

void __thiscall basisu::gpu_image::clear(gpu_image *this)

{
  this->m_fmt = cInvalidTextureFormat;
  this->m_width = 0;
  this->m_height = 0;
  this->m_blocks_x = 0;
  this->m_blocks_y = 0;
  this->m_blocks_y = 0;
  this->m_block_width = 0;
  this->m_block_height = 0;
  this->m_qwords_per_block = 0;
  vector<unsigned_long>::clear(&this->m_blocks);
  return;
}

Assistant:

void clear()
		{
			m_fmt = texture_format::cInvalidTextureFormat;
			m_width = 0;
			m_height = 0;
			m_block_width = 0;
			m_block_height = 0;
			m_blocks_x = 0;
			m_blocks_y = 0;
			m_qwords_per_block = 0;
			m_blocks.clear();
		}